

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.c
# Opt level: O1

char * lstep(re_guts *g,sopno start,sopno stop,char *bef,int ch,char *aft)

{
  sop sVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  int iVar9;
  
  if (start != stop) {
    uVar8 = start & 0xffffffff;
    do {
      iVar9 = (int)uVar8;
      sVar1 = g->strip[start];
      uVar4 = (uint)sVar1;
      switch((ulong)(uVar4 & 0x7c000000) - 0x4000000 >> 0x1a) {
      case 0:
        if (start != stop + -1) {
          __assert_fail("pc == stop-1",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                        ,0x344,"char *lstep()");
        }
        break;
      case 1:
        if ((char)sVar1 == ch) {
LAB_00109f0d:
          bVar7 = bef[iVar9];
          goto LAB_00109f14;
        }
        break;
      case 2:
        if ((ch & 0xfffffffdU) == 0x81) goto LAB_00109f0d;
        break;
      case 3:
        if ((ch & 0xfffffffeU) == 0x82) goto LAB_00109f0d;
        break;
      case 4:
        if (ch < 0x80) goto LAB_00109f0d;
        break;
      case 5:
        if ((ch < 0x80) &&
           (uVar8 = (ulong)((uVar4 & 0x3ffffff) << 5),
           (*(byte *)(*(long *)((long)&g->sets->ptr + uVar8) + (ulong)(ch & 0xff)) &
           (&g->sets->mask)[uVar8]) != 0)) goto LAB_00109f0d;
        break;
      case 6:
      case 7:
      case 8:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0x11:
        bVar7 = aft[iVar9];
LAB_00109f14:
        aft[(long)iVar9 + 1] = aft[(long)iVar9 + 1] | bVar7;
        break;
      case 9:
        lVar5 = (long)iVar9;
        aft[lVar5 + 1] = aft[lVar5 + 1] | aft[lVar5];
        lVar3 = lVar5 - (ulong)(uVar4 & 0x3ffffff);
        bVar7 = aft[lVar3];
        bVar6 = aft[lVar5] | bVar7;
        aft[lVar3] = bVar6;
        if (bVar6 != 0 && bVar7 == 0) {
          start = start + ~(ulong)(uVar4 & 0x3ffffff);
          iVar9 = (int)start;
        }
        break;
      case 10:
        bVar7 = aft[iVar9];
        aft[(long)iVar9 + 1] = aft[(long)iVar9 + 1] | bVar7;
        aft[(ulong)(uVar4 & 0x3ffffff) + (long)iVar9] =
             aft[(ulong)(uVar4 & 0x3ffffff) + (long)iVar9] | bVar7;
        break;
      case 0xe:
        bVar7 = aft[iVar9];
        aft[(long)iVar9 + 1] = aft[(long)iVar9 + 1] | bVar7;
        if ((*(uint *)(g->strip + start + (ulong)(uVar4 & 0x3ffffff)) & 0x7c000000) != 0x44000000) {
          __assert_fail("OP(g->strip[pc+OPND(s)]) == OOR2",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                        ,899,"char *lstep()");
        }
        aft[(long)iVar9 + (ulong)(uVar4 & 0x3ffffff)] =
             aft[(long)iVar9 + (ulong)(uVar4 & 0x3ffffff)] | bVar7;
        break;
      case 0xf:
        if (aft[iVar9] != 0) {
          lVar5 = 1;
          while( true ) {
            uVar2 = (uint)g->strip[start + lVar5];
            uVar4 = uVar2 & 0x7c000000;
            if (uVar4 != 0x44000000) break;
            lVar5 = lVar5 + (ulong)(uVar2 & 0x3ffffff);
          }
          if (uVar4 != 0x48000000) {
            __assert_fail("OP(s) == OOR2",
                          "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                          ,0x38b,"char *lstep()");
          }
          aft[iVar9 + lVar5] = aft[iVar9 + lVar5] | aft[iVar9];
        }
        break;
      case 0x10:
        bVar7 = aft[iVar9];
        aft[(long)iVar9 + 1] = aft[(long)iVar9 + 1] | bVar7;
        uVar2 = (uint)g->strip[start + (ulong)(uVar4 & 0x3ffffff)] & 0x7c000000;
        if (uVar2 == 0x44000000) {
          aft[(long)iVar9 + (ulong)(uVar4 & 0x3ffffff)] =
               aft[(long)iVar9 + (ulong)(uVar4 & 0x3ffffff)] | bVar7;
        }
        else if (uVar2 != 0x48000000) {
          __assert_fail("OP(g->strip[pc+OPND(s)]) == OOR2",
                        "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                        ,0x392,"char *lstep()");
        }
        break;
      case 0x12:
        if (ch == 0x85) goto LAB_00109f0d;
        break;
      case 0x13:
        if (ch == 0x86) goto LAB_00109f0d;
        break;
      default:
        __assert_fail("nope",
                      "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                      ,0x39a,"char *lstep()");
      }
      start = start + 1;
      uVar8 = (ulong)(iVar9 + 1);
    } while (start != stop);
  }
  return aft;
}

Assistant:

static states
step(g, start, stop, bef, ch, aft)
struct re_guts *g;
sopno start;			/* start state within strip */
sopno stop;			/* state after stop state within strip */
states bef;		/* states reachable before */
int ch;				/* character or NONCHAR code */
states aft;		/* states already known reachable after */
{
	cset *cs;
	sop s;
	sopno pc;
	onestate here;		/* note, macros know this name */
	sopno look;
	long i;

	for (pc = start, INIT(here, pc); pc != stop; pc++, INC(here)) {
		s = g->strip[pc];
		switch (OP(s)) {
		case OEND:
			assert(pc == stop-1);
			break;
		case OCHAR:
			/* only characters can match */
			assert(!NONCHAR(ch) || ch != (char)OPND(s));
			if (ch == (char)OPND(s))
				FWD(aft, bef, 1);
			break;
		case OBOL:
			if (ch == BOL || ch == BOLEOL)
				FWD(aft, bef, 1);
			break;
		case OEOL:
			if (ch == EOL || ch == BOLEOL)
				FWD(aft, bef, 1);
			break;
		case OBOW:
			if (ch == BOW)
				FWD(aft, bef, 1);
			break;
		case OEOW:
			if (ch == EOW)
				FWD(aft, bef, 1);
			break;
		case OANY:
			if (!NONCHAR(ch))
				FWD(aft, bef, 1);
			break;
		case OANYOF:
			cs = &g->sets[OPND(s)];
			if (!NONCHAR(ch) && CHIN(cs, ch))
				FWD(aft, bef, 1);
			break;
		case OBACK_:		/* ignored here */
		case O_BACK:
			FWD(aft, aft, 1);
			break;
		case OPLUS_:		/* forward, this is just an empty */
			FWD(aft, aft, 1);
			break;
		case O_PLUS:		/* both forward and back */
			FWD(aft, aft, 1);
			i = ISSETBACK(aft, OPND(s));
			BACK(aft, aft, OPND(s));
			if (!i && ISSETBACK(aft, OPND(s))) {
				/* oho, must reconsider loop body */
				pc -= OPND(s) + 1;
				INIT(here, pc);
			}
			break;
		case OQUEST_:		/* two branches, both forward */
			FWD(aft, aft, 1);
			FWD(aft, aft, OPND(s));
			break;
		case O_QUEST:		/* just an empty */
			FWD(aft, aft, 1);
			break;
		case OLPAREN:		/* not significant here */
		case ORPAREN:
			FWD(aft, aft, 1);
			break;
		case OCH_:		/* mark the first two branches */
			FWD(aft, aft, 1);
			assert(OP(g->strip[pc+OPND(s)]) == OOR2);
			FWD(aft, aft, OPND(s));
			break;
		case OOR1:		/* done a branch, find the O_CH */
			if (ISSTATEIN(aft, here)) {
				for (look = 1;
						OP(s = g->strip[pc+look]) != O_CH;
						look += OPND(s))
					assert(OP(s) == OOR2);
				FWD(aft, aft, look);
			}
			break;
		case OOR2:		/* propagate OCH_'s marking */
			FWD(aft, aft, 1);
			if (OP(g->strip[pc+OPND(s)]) != O_CH) {
				assert(OP(g->strip[pc+OPND(s)]) == OOR2);
				FWD(aft, aft, OPND(s));
			}
			break;
		case O_CH:		/* just empty */
			FWD(aft, aft, 1);
			break;
		default:		/* ooooops... */
			assert(nope);
			break;
		}
	}

	return(aft);
}